

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Option<Catch::TestRunInfo> * __thiscall
Catch::Option<Catch::TestRunInfo>::operator=(Option<Catch::TestRunInfo> *this,TestRunInfo *_value)

{
  Option<Catch::TestRunInfo> *in_RDI;
  TestRunInfo *in_stack_ffffffffffffffd8;
  Option<Catch::TestRunInfo> *in_stack_ffffffffffffffe0;
  char *this_00;
  
  reset(in_stack_ffffffffffffffe0);
  this_00 = in_RDI->storage;
  TestRunInfo::TestRunInfo((TestRunInfo *)this_00,in_stack_ffffffffffffffd8);
  in_RDI->nullableValue = (TestRunInfo *)this_00;
  return in_RDI;
}

Assistant:

Option& operator = ( T const& _value ) {
            reset();
            nullableValue = new( storage ) T( _value );
            return *this;
        }